

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  int iVar1;
  void *pvVar2;
  undefined4 in_ESI;
  long in_RDI;
  ImSpanAllocator<3> span_allocator;
  char *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  ImSpanAllocator<3> *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  ImSpanAllocator<3>::ImSpanAllocator((ImSpanAllocator<3> *)0x239307);
  ImSpanAllocator<3>::ReserveBytes
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,(size_t)in_stack_ffffffffffffffd0);
  ImSpanAllocator<3>::ReserveBytes
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,(size_t)in_stack_ffffffffffffffd0);
  ImSpanAllocator<3>::ReserveBytes
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,(size_t)in_stack_ffffffffffffffd0);
  ImSpanAllocator<3>::GetArenaSizeInBytes((ImSpanAllocator<3> *)&stack0xffffffffffffffd0);
  pvVar2 = MemAlloc((size_t)in_stack_ffffffffffffffd0);
  *(void **)(in_RDI + 8) = pvVar2;
  pvVar2 = *(void **)(in_RDI + 8);
  iVar1 = ImSpanAllocator<3>::GetArenaSizeInBytes((ImSpanAllocator<3> *)&stack0xffffffffffffffd0);
  memset(pvVar2,0,(long)iVar1);
  ImSpanAllocator<3>::SetArenaBasePtr
            ((ImSpanAllocator<3> *)&stack0xffffffffffffffd0,*(void **)(in_RDI + 8));
  ImSpanAllocator<3>::GetSpan<ImGuiTableColumn>
            ((ImSpanAllocator<3> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec,(ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffffe0);
  ImSpanAllocator<3>::GetSpan<signed_char>
            ((ImSpanAllocator<3> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec,(ImSpan<signed_char> *)in_stack_ffffffffffffffe0);
  ImSpanAllocator<3>::GetSpan<ImGuiTableCellData>
            ((ImSpanAllocator<3> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec,(ImSpan<ImGuiTableCellData> *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    ImSpanAllocator<3> span_allocator;
    span_allocator.ReserveBytes(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.ReserveBytes(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.ReserveBytes(2, columns_count * sizeof(ImGuiTableCellData));
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
}